

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall VertexAttrib64Bit::VAOTest::initBuffers(VAOTest *this)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  uchar *puVar4;
  ulong uVar5;
  unsigned_short *puVar6;
  uint local_84;
  uint n_element_4;
  uchar *matrix_ptr_1;
  uint n_matrix_1;
  char *data_ptr_2;
  uint n_element_3;
  uchar *data2_ptr;
  uchar *data1_ptr;
  uint n_batch;
  unsigned_short *data_ptr_1;
  uint n_element_2;
  uchar *data_ptr;
  uint n_element_1;
  uint n_element;
  double *matrix_ptr;
  uint n_matrix;
  unsigned_short n_index;
  anon_union_8_2_94730042 u;
  VAOTest *this_local;
  
  this->m_bo_1_data_size = this->m_bo_1_batch_size * this->m_n_batches;
  this->m_bo_2_data_size = this->m_bo_2_batch_size * this->m_n_batches;
  this->m_bo_index_data_size = this->m_n_batches << 1;
  puVar4 = (uchar *)operator_new__((ulong)this->m_bo_1_data_size);
  this->m_bo_1_data = puVar4;
  puVar4 = (uchar *)operator_new__((ulong)this->m_bo_2_data_size);
  this->m_bo_2_data = puVar4;
  auVar3 = ZEXT416(this->m_bo_index_data_size >> 1) * ZEXT816(2);
  uVar5 = auVar3._0_8_;
  if (auVar3._8_8_ != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar6 = (unsigned_short *)operator_new__(uVar5);
  this->m_bo_index_data = puVar6;
  for (matrix_ptr._6_2_ = 0; (uint)matrix_ptr._6_2_ < (this->m_n_batches & 0xffff);
      matrix_ptr._6_2_ = matrix_ptr._6_2_ + 1) {
    this->m_bo_index_data[matrix_ptr._6_2_] = ((short)this->m_n_batches + -1) - matrix_ptr._6_2_;
  }
  for (matrix_ptr._0_4_ = 0; (uint)matrix_ptr < this->m_n_batches;
      matrix_ptr._0_4_ = (uint)matrix_ptr + 1) {
    puVar4 = this->m_bo_1_data;
    uVar1 = this->m_bo_1_batch_size;
    uVar2 = this->m_bo_1_offset_matrix;
    for (data_ptr._4_4_ = 0; data_ptr._4_4_ < 9; data_ptr._4_4_ = data_ptr._4_4_ + 1) {
      *(double *)
       (puVar4 + (ulong)data_ptr._4_4_ * 8 + (ulong)uVar2 + (ulong)((uint)matrix_ptr * uVar1)) =
           (double)(data_ptr._4_4_ + 1 + (uint)matrix_ptr * 9);
    }
  }
  for (data_ptr._0_4_ = 0; (uint)data_ptr < this->m_n_batches; data_ptr._0_4_ = (uint)data_ptr + 1)
  {
    this->m_bo_1_data
    [(ulong)this->m_bo_1_offset_ubyte + (ulong)((uint)data_ptr * this->m_bo_1_batch_size)] =
         (uchar)(uint)data_ptr;
  }
  for (data_ptr_1._4_4_ = 0; data_ptr_1._4_4_ < this->m_n_batches;
      data_ptr_1._4_4_ = data_ptr_1._4_4_ + 1) {
    *(short *)(this->m_bo_1_data +
              (ulong)this->m_bo_1_offset_short + (ulong)(data_ptr_1._4_4_ * this->m_bo_1_batch_size)
              ) = (short)data_ptr_1._4_4_;
  }
  for (data1_ptr._4_4_ = 0; data1_ptr._4_4_ < this->m_n_batches;
      data1_ptr._4_4_ = data1_ptr._4_4_ + 1) {
    puVar4 = this->m_bo_1_data;
    uVar1 = this->m_bo_1_batch_size;
    uVar2 = this->m_bo_1_offset_double;
    *(double *)(puVar4 + (ulong)uVar2 + (ulong)(data1_ptr._4_4_ * uVar1)) =
         (double)(data1_ptr._4_4_ * 2);
    *(double *)((long)(puVar4 + (ulong)uVar2 + (ulong)(data1_ptr._4_4_ * uVar1)) + 8) =
         (double)(data1_ptr._4_4_ * 2 + 1);
  }
  for (data_ptr_2._4_4_ = 0; data_ptr_2._4_4_ < this->m_n_batches;
      data_ptr_2._4_4_ = data_ptr_2._4_4_ + 1) {
    this->m_bo_2_data
    [(ulong)this->m_bo_2_offset_sbyte + (ulong)(data_ptr_2._4_4_ * this->m_bo_2_batch_size)] =
         (uchar)data_ptr_2._4_4_;
  }
  for (matrix_ptr_1._4_4_ = 0; matrix_ptr_1._4_4_ < this->m_n_batches;
      matrix_ptr_1._4_4_ = matrix_ptr_1._4_4_ + 1) {
    puVar4 = this->m_bo_2_data;
    uVar1 = this->m_bo_2_batch_size;
    uVar2 = this->m_bo_2_offset_matrix;
    for (local_84 = 0; local_84 < 8; local_84 = local_84 + 1) {
      *(double *)(puVar4 + (ulong)local_84 * 8 + (ulong)uVar2 + (ulong)(matrix_ptr_1._4_4_ * uVar1))
           = (double)(local_84 + matrix_ptr_1._4_4_ * 8);
    }
  }
  return;
}

Assistant:

void VAOTest::initBuffers()
{
	DE_ASSERT(m_bo_1_data == DE_NULL);
	DE_ASSERT(m_bo_2_data == DE_NULL);
	DE_ASSERT(m_bo_index_data == DE_NULL);

	/* Prepare buffers storing underlying data. The buffers will be used for:
	 *
	 * - storage purposes;
	 * - verification of the data XFBed from the vertex shader.
	 */
	m_bo_1_data_size	 = m_bo_1_batch_size * m_n_batches;
	m_bo_2_data_size	 = m_bo_2_batch_size * m_n_batches;
	m_bo_index_data_size = static_cast<unsigned int>(sizeof(unsigned short) * m_n_batches);

	m_bo_1_data		= new unsigned char[m_bo_1_data_size];
	m_bo_2_data		= new unsigned char[m_bo_2_data_size];
	m_bo_index_data = new unsigned short[m_bo_index_data_size / sizeof(unsigned short)];

	/* Workaround for alignment issue that may result in bus error on some platforms */
	union {
		double		  d;
		unsigned char c[sizeof(double)];
	} u;

	/* Fill index data */
	for (unsigned short n_index = 0; n_index < (unsigned short)m_n_batches; ++n_index)
	{
		m_bo_index_data[n_index] = (unsigned short)((unsigned short)(m_n_batches - 1) - n_index);
	}

	/* Fill 3x3 matrix data in BO1 */
	for (unsigned int n_matrix = 0; n_matrix < m_n_batches; ++n_matrix)
	{
		double* matrix_ptr = (double*)(m_bo_1_data + n_matrix * m_bo_1_batch_size + m_bo_1_offset_matrix);

		for (unsigned int n_element = 0; n_element < 9 /* 3x3 matrix */; ++n_element)
		{
			matrix_ptr[n_element] = (double)(n_matrix * 3 * 3 + n_element + 1);
		}
	} /* for (all matrices) */

	/* Fill unsigned byte data in BO1 */
	for (unsigned int n_element = 0; n_element < m_n_batches; ++n_element)
	{
		unsigned char* data_ptr = m_bo_1_data + n_element * m_bo_1_batch_size + m_bo_1_offset_ubyte;

		*data_ptr = (unsigned char)n_element;
	}

	/* Fill short data in BO1 */
	for (unsigned int n_element = 0; n_element < m_n_batches; ++n_element)
	{
		unsigned short* data_ptr = (unsigned short*)(m_bo_1_data + n_element * m_bo_1_batch_size + m_bo_1_offset_short);

		*data_ptr = (unsigned short)n_element;
	}

	/* Fill 2 doubles data in BO1 */
	for (unsigned int n_batch = 0; n_batch < m_n_batches; ++n_batch)
	{
		unsigned char* data1_ptr = m_bo_1_data + n_batch * m_bo_1_batch_size + m_bo_1_offset_double;
		unsigned char* data2_ptr = data1_ptr + sizeof(double);

		u.d = (double)(2 * n_batch);
		memcpy(data1_ptr, u.c, sizeof(double));
		u.d = (double)(2 * n_batch + 1);
		memcpy(data2_ptr, u.c, sizeof(double));
	}

	/* Fill signed byte data in BO2 */
	for (unsigned int n_element = 0; n_element < m_n_batches; ++n_element)
	{
		signed char* data_ptr = (signed char*)(m_bo_2_data + n_element * m_bo_2_batch_size + m_bo_2_offset_sbyte);

		*data_ptr = (signed char)n_element;
	}

	/* Fill 4x2 matrix data in BO2 */
	for (unsigned int n_matrix = 0; n_matrix < m_n_batches; ++n_matrix)
	{
		unsigned char* matrix_ptr = m_bo_2_data + n_matrix * m_bo_2_batch_size + m_bo_2_offset_matrix;

		for (unsigned int n_element = 0; n_element < 8 /* 4x2 matrix */; ++n_element)
		{
			u.d = (double)(n_matrix * 4 * 2 + n_element);
			memcpy(matrix_ptr + (sizeof(double) * n_element), u.c, sizeof(double));
		}
	} /* for (all matrices) */
}